

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tester.cpp
# Opt level: O1

void TestFunctional(void)

{
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Test Functional",0xf);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '(');
  std::ostream::put('(');
  std::ostream::flush();
  FunctionalTester<short,_void>::Test();
  FunctionalTester<unsigned_short,_void>::Test();
  FunctionalTester<int,_void>::Test();
  FunctionalTester<unsigned_int,_void>::Test();
  FunctionalTester<long,_void>::Test();
  FunctionalTester<unsigned_long,_void>::Test();
  FunctionalTester<long_long,_void>::Test();
  FunctionalTester<unsigned_long_long,_void>::Test();
  return;
}

Assistant:

void TestFunctional()
{
    std::cout << "Test Functional" << std::endl;
    FunctionalTester<short>::Test();
    FunctionalTester<unsigned short>::Test();
    FunctionalTester<int>::Test();
    FunctionalTester<unsigned int>::Test();
    FunctionalTester<long>::Test();
    FunctionalTester<unsigned long>::Test();
    FunctionalTester<long long>::Test();
    FunctionalTester<unsigned long long>::Test();
}